

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O2

int gobj_shouldvis(t_gobj *x,_glist *glist)

{
  _class *p_Var1;
  int iVar2;
  int iVar3;
  t_object *ptVar4;
  int y2;
  int y1;
  int x2;
  int x1;
  int gy2;
  int gx2;
  int gy1;
  int gx1;
  
  if (((*(ushort *)&glist->field_0xe8 & 0x101) == 0x100) &&
     (((byte)(*(ushort *)&glist->field_0xe8 >> 0xb) & 1) == 0 && glist->gl_owner != (_glist *)0x0))
  {
    iVar3 = gobj_shouldvis((t_gobj *)glist,glist->gl_owner);
    if (iVar3 == 0) {
      return 0;
    }
    if ((glist->field_0xe8 & 0x80) != 0) {
      if (x->g_pd == scalar_class) {
        return 1;
      }
      if (x->g_pd == garray_class) {
        return 1;
      }
      gobj_getrect((t_gobj *)glist,glist->gl_owner,&x1,&y1,&x2,&y2);
      iVar2 = x1;
      iVar3 = y1;
      if (x2 < x1) {
        x1 = x2;
        x2 = iVar2;
      }
      if (y2 < y1) {
        y1 = y2;
        y2 = iVar3;
      }
      gobj_getrect(x,glist,&gx1,&gy1,&gx2,&gy2);
      if (gx1 < x1) {
        return 0;
      }
      if (x2 < gx1) {
        return 0;
      }
      if (x2 < gx2 || gx2 < x1) {
        return 0;
      }
      if (gy1 < y1) {
        return 0;
      }
      if (y2 < gy1) {
        return 0;
      }
      if (y2 < gy2 || gy2 < y1) {
        return 0;
      }
    }
  }
  ptVar4 = pd_checkobject(&x->g_pd);
  if (ptVar4 == (t_object *)0x0) {
    return 1;
  }
  if ((*(ushort *)&glist->field_0xe8 & 1) != 0) {
    return 1;
  }
  p_Var1 = (ptVar4->te_g).g_pd;
  if (p_Var1 == canvas_class) {
    if ((ptVar4[4].te_xpix & 0x100) != 0) {
      return 1;
    }
  }
  else if (p_Var1->c_wb != &text_widgetbehavior) {
    return 1;
  }
  if (-1 < (char)*(ushort *)&glist->field_0xe8) {
    return 0;
  }
  return (uint)((ptVar4->field_0x2e & 3) == 0);
}

Assistant:

int gobj_shouldvis(t_gobj *x, struct _glist *glist)
{
    t_object *ob;
    int has_parent = !glist->gl_havewindow && glist->gl_isgraph
        && glist->gl_owner && !glist->gl_isclone;
        /* if our parent is a graph, and if that graph itself isn't
           visible, then we aren't either. */
    if (has_parent && !gobj_shouldvis(&glist->gl_gobj, glist->gl_owner))
            return (0);
        /* if we're graphing-on-parent and the object falls outside the
           graph rectangle, don't draw it. */
    if (has_parent && glist->gl_goprect)
    {
        int x1, y1, x2, y2, gx1, gy1, gx2, gy2, m;
            /* for some reason the bounds check on arrays and scalars
               don't seem to apply here.  Perhaps this was in order to allow
               arrays to reach outside their containers?  I no longer understand
               this. */
        if (pd_class(&x->g_pd) == scalar_class
            || pd_class(&x->g_pd) == garray_class)
                return (1);
        gobj_getrect(&glist->gl_gobj, glist->gl_owner, &x1, &y1, &x2, &y2);
        if (x1 > x2)
            m = x1, x1 = x2, x2 = m;
        if (y1 > y2)
            m = y1, y1 = y2, y2 = m;
        gobj_getrect(x, glist, &gx1, &gy1, &gx2, &gy2);
#if 0
        post("graph %d %d %d %d, %s %d %d %d %d",
             x1, x2, y1, y2, class_gethelpname(x->g_pd), gx1, gx2, gy1, gy2);
#endif
        if (gx1 < x1 || gx1 > x2 || gx2 < x1 || gx2 > x2 ||
            gy1 < y1 || gy1 > y2 || gy2 < y1 || gy2 > y2)
                return (0);
    }
    if ((ob = pd_checkobject(&x->g_pd)))
    {
            /* return true if the text box should be drawn.  We don't show text
               boxes inside graphs---except comments, if we're doing the new
               (goprect) style. */
        return (glist->gl_havewindow ||
            (ob->te_pd != canvas_class &&
                ob->te_pd->c_wb != &text_widgetbehavior) ||
            (ob->te_pd == canvas_class && (((t_glist *)ob)->gl_isgraph)) ||
            (glist->gl_goprect && (ob->te_type == T_TEXT)));
    }
    else return (1);
}